

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O1

locale __thiscall
booster::locale::impl_posix::create_codecvt
          (impl_posix *this,locale *in,string *encoding,character_facet_type type)

{
  int iVar1;
  pointer *__ptr;
  string local_50;
  
  conv::impl::normalize_encoding_abi_cxx11_
            (&local_50,(impl *)(encoding->_M_dataplus)._M_p,(char *)encoding);
  iVar1 = std::__cxx11::string::compare((char *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (iVar1 == 0) {
    util::create_utf8_codecvt((util *)this,in,type);
  }
  else {
    util::create_simple_codecvt((util *)this,in,encoding,type);
  }
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_codecvt(std::locale const &in,std::string const &encoding,character_facet_type type)
    {
        if(conv::impl::normalize_encoding(encoding.c_str())=="utf8")
            return util::create_utf8_codecvt(in,type);

        try {
            return util::create_simple_codecvt(in,encoding,type);
        }
        catch(conv::invalid_charset_error const &) {
            std::unique_ptr<util::base_converter> cvt;
            cvt = create_iconv_converter(encoding);
            return util::create_codecvt(in,std::move(cvt),type);
        }
    }